

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O1

void __thiscall I2sAnalyzer::WorkerThread(I2sAnalyzer *this)

{
  AnalyzerChannelData *pAVar1;
  
  this->mArrowMarker = ((this->mSettings)._M_ptr)->mDataValidEdge == NegEdge | UpArrow;
  pAVar1 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mClock = pAVar1;
  pAVar1 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mFrame = pAVar1;
  pAVar1 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mData = pAVar1;
  SetupForGettingFirstBit(this);
  SetupForGettingFirstFrame(this);
  do {
    GetFrame(this);
    AnalyzeFrame(this);
    AnalyzerResults::CommitResults();
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void I2sAnalyzer::WorkerThread()
{
    // UpArrow, DownArrow
    if( mSettings->mDataValidEdge == AnalyzerEnums::NegEdge )
        mArrowMarker = AnalyzerResults::DownArrow;
    else
        mArrowMarker = AnalyzerResults::UpArrow;

    mClock = GetAnalyzerChannelData( mSettings->mClockChannel );
    mFrame = GetAnalyzerChannelData( mSettings->mFrameChannel );
    mData = GetAnalyzerChannelData( mSettings->mDataChannel );

    SetupForGettingFirstBit();
    SetupForGettingFirstFrame();

    for( ;; )
    {
        GetFrame();
        AnalyzeFrame();

        mResults->CommitResults();
        ReportProgress( mClock->GetSampleNumber() );
        CheckIfThreadShouldExit();
    }
}